

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O0

void __thiscall tt::Logger::Logger(Logger *this,char *fileName,int line)

{
  int line_local;
  char *fileName_local;
  Logger *this_local;
  
  Impl::Impl(&this->m_impl,fileName,line);
  return;
}

Assistant:

Logger::Logger(const char* fileName, int line)
	:m_impl(fileName,line){
	
	}